

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visitCallIndirect(wasm::CallIndirect__(void *this,CallIndirect *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Value *pVVar2;
  Expression *pEVar3;
  Wasm2JSBuilder *pWVar4;
  ScopedTemp *this_00;
  bool bVar5;
  bool bVar6;
  JsType JVar7;
  Expression **ppEVar8;
  Ref RVar9;
  pointer ppSVar10;
  ArenaVector<wasm::Expression_*> *__dest;
  Ref RVar11;
  undefined8 *puVar12;
  Type TVar13;
  char *pcVar14;
  ArenaVector<wasm::Expression_*> *extraout_RDX;
  ArenaVector<wasm::Expression_*> *extraout_RDX_00;
  ArenaVector<wasm::Expression_*> *pAVar15;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  ulong uVar16;
  pointer __p;
  size_t i;
  ArenaVector<wasm::Expression_*> *pAVar17;
  size_t __n;
  ArenaVector<wasm::Expression_*> *pAVar18;
  size_t index;
  iterator __begin3_2;
  ArenaVector<wasm::Expression_*> *this_01;
  IString nextResult;
  IString nextResult_00;
  IString op;
  IString possible;
  IString possible_00;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  undefined1 auVar19 [16];
  undefined1 local_390 [8];
  EffectAnalyzer targetEffects;
  undefined1 local_208 [8];
  ScopedTemp idx;
  Ref local_80;
  Ref theCall;
  undefined1 auStack_68 [8];
  Iterator __begin3;
  Ref local_38;
  Ref ret;
  
  if (curr[0x50] == (CallIndirect)0x1) {
    Fatal::Fatal((Fatal *)local_390);
    Fatal::operator<<((Fatal *)local_390,(char (*) [40])"tail calls not yet supported in wasm2js");
    Fatal::~Fatal((Fatal *)local_390);
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_390,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),*(Expression **)(curr + 0x38));
  bVar5 = EffectAnalyzer::hasAnything((EffectAnalyzer *)local_390);
  if (bVar5) {
    pAVar1 = (ArenaVector<wasm::Expression_*> *)(curr + 0x18);
    __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar15 = *(ArenaVector<wasm::Expression_*> **)(curr + 0x20);
    auStack_68 = (undefined1  [8])pAVar1;
    for (; bVar5 = auStack_68 != (undefined1  [8])pAVar1 || __begin3.parent != pAVar15,
        auStack_68 != (undefined1  [8])pAVar1 || __begin3.parent != pAVar15;
        __begin3.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin3.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1)) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)auStack_68);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_208,(PassOptions *)(*this + 0x60),
                 *(Module **)((long)this + 0x20),*ppEVar8);
      bVar6 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_390,(EffectAnalyzer *)local_208);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_208);
      if (bVar6) break;
    }
  }
  else {
    bVar5 = false;
  }
  nextResult.str._M_str = cashew::RSHIFT;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar9 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x38),nextResult);
  auVar19 = makeJsCoercion(RVar9,JS_INT);
  name.str._M_str = auVar19._8_8_;
  TVar13.id = auVar19._0_8_;
  if (bVar5) {
    local_38.inst = (Value *)0x0;
    possible.str._M_str = _finalize;
    possible.str._M_len = (size_t)NO_RESULT;
    RVar9.inst = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_208,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
    __begin3.index = 0;
    pAVar1 = (ArenaVector<wasm::Expression_*> *)(curr + 0x18);
    pcVar14 = (char *)&stack0xffffffffffffff80;
    theCall.inst = (Value *)0x0;
    auStack_68 = (undefined1  [8])0x0;
    __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pVVar2 = *(Value **)(curr + 0x20);
    pAVar15 = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar17 = (ArenaVector<wasm::Expression_*> *)0x0;
    this_01 = (ArenaVector<wasm::Expression_*> *)0x0;
    local_80.inst = (Value *)pAVar1;
    while ((theCall.inst != pVVar2 || ((ArenaVector<wasm::Expression_*> *)local_80.inst != pAVar1)))
    {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&stack0xffffffffffffff80);
      pEVar3 = *ppEVar8;
      ppEVar8 = (Expression **)operator_new(0x28);
      possible_00.str._M_str = _finalize;
      possible_00.str._M_len = (size_t)NO_RESULT;
      RVar9.inst = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (ppEVar8,(Type)(pEVar3->type).id,*this,*(Function **)((long)this + 0x18),possible_00
                );
      if (pAVar17 == pAVar15) {
        __n = (long)pAVar15 - (long)this_01;
        if (__n == 0x7ffffffffffffff8) {
          auStack_68 = (undefined1  [8])this_01;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n >> 3);
        ppSVar10 = (pointer)0x1;
        if (pAVar15 != this_01) {
          ppSVar10 = __p;
        }
        uVar16 = (long)ppSVar10 + (long)__p;
        if (0xffffffffffffffe < uVar16) {
          uVar16 = 0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppSVar10,(ulong)__p)) {
          uVar16 = 0xfffffffffffffff;
        }
        if (uVar16 == 0) {
          __dest = (ArenaVector<wasm::Expression_*> *)0x0;
        }
        else {
          __dest = (ArenaVector<wasm::Expression_*> *)operator_new(uVar16 * 8);
          pAVar15 = extraout_RDX;
        }
        (&(__dest->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data)
        [(long)__p] = ppEVar8;
        if (0 < (long)__n) {
          memmove(__dest,this_01,__n);
          pAVar15 = extraout_RDX_00;
        }
        pAVar18 = (ArenaVector<wasm::Expression_*> *)(__n + (long)__dest);
        std::
        _Vector_base<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
        ::_M_deallocate((_Vector_base<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                         *)this_01,__p,(size_t)pAVar15);
        pAVar15 = (ArenaVector<wasm::Expression_*> *)
                  (&(__dest->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                  + uVar16);
        __begin3.index = (size_t)pAVar15;
      }
      else {
        (pAVar17->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data =
             ppEVar8;
        __dest = this_01;
        pAVar18 = pAVar17;
      }
      pAVar17 = (ArenaVector<wasm::Expression_*> *)
                &(pAVar18->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                 usedElements;
      __begin3.parent = pAVar17;
      RVar11 = visitAndAssign(wasm::Expression*,wasm::IString_
                         (this,pEVar3,
                          (IString)*(string_view *)
                                    ((pAVar18->
                                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ).data + 2));
      sequenceAppend(&local_38,RVar11);
      theCall.inst = (Value *)((long)&(theCall.inst)->type + 1);
      pcVar14 = extraout_RDX_01;
      this_01 = __dest;
    }
    name_00.str._M_str = pcVar14;
    name_00.str._M_len = idx.temp.str._M_len;
    auStack_68 = (undefined1  [8])this_01;
    RVar11 = cashew::ValueBuilder::makeName((ValueBuilder *)idx.type.id,name_00);
    op.str._M_str = (char *)TVar13.id;
    op.str._M_len = BLOCK;
    RVar9 = cashew::ValueBuilder::makeBinary(RVar11.inst,cashew::SET,op,RVar9);
    sequenceAppend(&local_38,RVar9);
    name_01.str._M_str = extraout_RDX_02;
    name_01.str._M_len = _isBottom;
    RVar9 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_01);
    TVar13.id = (uintptr_t)
                processFunctionBody::ExpressionProcessor::ScopedTemp::getAstName
                          ((ScopedTemp *)local_208);
    RVar9 = cashew::ValueBuilder::makeSub(RVar9,(Ref)TVar13.id);
    local_80 = cashew::ValueBuilder::makeCall(RVar9);
    for (index = 0; RVar9.inst = local_80.inst, (long)pAVar17 - (long)this_01 >> 3 != index;
        index = index + 1) {
      ppEVar8 = (&(this_01->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data)
                [index];
      pEVar3 = ppEVar8[2];
      TVar13.id = (uintptr_t)ppEVar8[3];
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           pAVar1,index);
      auVar19 = cashew::Ref::operator[]((uint)&stack0xffffffffffffff80);
      name_02.str._M_str = auVar19._8_8_;
      pVVar2 = (Value *)*auVar19._0_8_;
      name_02.str._M_len = TVar13.id;
      RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)pEVar3,name_02);
      JVar7 = ::wasm::wasmToJsType((wasm *)((*ppEVar8)->type).id,TVar13);
      TVar13.id = makeJsCoercion(RVar9,JVar7);
      cashew::Value::push_back(pVVar2,(Ref)TVar13.id);
    }
    JVar7 = ::wasm::wasmToJsType(*(wasm **)(curr + 8),TVar13);
    local_80.inst = (Value *)makeJsCoercion(RVar9,JVar7);
    sequenceAppend(&local_38,local_80);
    for (; this_01 != pAVar17;
        this_01 = (ArenaVector<wasm::Expression_*> *)
                  &(this_01->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                   usedElements) {
      this_00 = (ScopedTemp *)
                (this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                ).data;
      if (this_00 != (ScopedTemp *)0x0) {
        processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp(this_00);
      }
      operator_delete(this_00,0x28);
    }
    std::
    vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>::
    ~vector((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
             *)auStack_68);
    processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_208);
  }
  else {
    name.str._M_len = _isBottom;
    RVar9 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name);
    RVar9 = cashew::ValueBuilder::makeSub(RVar9,(Ref)TVar13.id);
    local_38 = cashew::ValueBuilder::makeCall(RVar9);
    idx.parent = (Wasm2JSBuilder *)0x0;
    pWVar4 = *(Wasm2JSBuilder **)(curr + 0x20);
    local_208 = (undefined1  [8])(curr + 0x18);
    while ((RVar9.inst = local_38.inst, idx.parent != pWVar4 ||
           (local_208 != (undefined1  [8])(curr + 0x18)))) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_208);
      pEVar3 = *ppEVar8;
      puVar12 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      pVVar2 = (Value *)*puVar12;
      nextResult_00.str._M_str = cashew::RSHIFT;
      nextResult_00.str._M_len = EXPRESSION_RESULT;
      TVar13.id = (uintptr_t)visit(wasm::Expression*,wasm::IString_(this,pEVar3,nextResult_00);
      cashew::Value::push_back(pVVar2,(Ref)TVar13.id);
      idx.parent = (Wasm2JSBuilder *)((long)&((idx.parent)->dataIndices)._M_h._M_buckets + 1);
    }
    JVar7 = ::wasm::wasmToJsType(*(wasm **)(curr + 8),TVar13);
    local_38.inst = (Value *)makeJsCoercion(RVar9,JVar7);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_390);
  return (Ref)local_38.inst;
}

Assistant:

Ref visitCallIndirect(CallIndirect* curr) {
      if (curr->isReturn) {
        Fatal() << "tail calls not yet supported in wasm2js";
      }
      // If the target has effects that interact with the operands, we must
      // reorder it to the start.
      bool mustReorder = false;
      EffectAnalyzer targetEffects(parent->options, *module, curr->target);
      if (targetEffects.hasAnything()) {
        for (auto* operand : curr->operands) {
          if (targetEffects.invalidates(
                EffectAnalyzer(parent->options, *module, operand))) {
            mustReorder = true;
            break;
          }
        }
      }
      // Ensure the function pointer is a number. In general in wasm2js we are
      // ok with true/false being present, as they are immediately cast to a
      // number anyhow on their use. However, FUNCTION_TABLE[true] is *not* the
      // same as FUNCTION_TABLE[1], so we must cast. This is a rare exception
      // because FUNCTION_TABLE is just a normal JS object, not a typed array
      // or a mathematical operation (all of which coerce to a number for us).
      auto target = visit(curr->target, EXPRESSION_RESULT);
      target = makeJsCoercion(target, JS_INT);
      if (mustReorder) {
        Ref ret;
        ScopedTemp idx(Type::i32, parent, func);
        std::vector<ScopedTemp*> temps; // TODO: utility class, with destructor?
        for (auto* operand : curr->operands) {
          temps.push_back(new ScopedTemp(operand->type, parent, func));
          IString temp = temps.back()->temp;
          sequenceAppend(ret, visitAndAssign(operand, temp));
        }
        sequenceAppend(ret,
                       ValueBuilder::makeBinary(
                         ValueBuilder::makeName(idx.getName()), SET, target));
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), idx.getAstName()));
        for (size_t i = 0; i < temps.size(); i++) {
          IString temp = temps[i]->temp;
          auto& operand = curr->operands[i];
          theCall[2]->push_back(makeJsCoercion(ValueBuilder::makeName(temp),
                                               wasmToJsType(operand->type)));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        sequenceAppend(ret, theCall);
        for (auto temp : temps) {
          delete temp;
        }
        return ret;
      } else {
        // Target has no side effects, emit simple code
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), target));
        for (auto* operand : curr->operands) {
          theCall[2]->push_back(visit(operand, EXPRESSION_RESULT));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        return theCall;
      }
    }